

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTest.cxx
# Opt level: O0

void __thiscall cmCTest::AddSiteProperties(cmCTest *this,cmXMLWriter *xml)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  init;
  bool bVar1;
  cmCTestScriptHandler *this_00;
  cmState *pcVar2;
  cmake *this_01;
  string *psVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_268;
  allocator<char> local_1f9;
  string local_1f8;
  allocator<char> local_1d1;
  string local_1d0;
  allocator<char> local_1a9;
  string local_1a8;
  cmValue local_188;
  cmValue label;
  string local_178;
  reference local_158;
  string *i;
  iterator __end3;
  iterator __begin3;
  cmList *__range3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  iterator local_110;
  size_type local_108;
  undefined1 local_100 [8];
  cmList args;
  string local_e0;
  allocator<char> local_b9;
  string local_b8;
  cmValue local_98;
  cmValue labels;
  string local_88;
  allocator<char> local_51;
  string local_50;
  cmValue local_30;
  cmValue subproject;
  cmake *cm;
  cmCTestScriptHandler *ch;
  cmXMLWriter *xml_local;
  cmCTest *this_local;
  
  this_00 = GetScriptHandler(this);
  subproject.Value = (string *)cmCTestScriptHandler::GetCMake(this_00);
  if ((cmake *)subproject.Value != (cmake *)0x0) {
    pcVar2 = cmake::GetState((cmake *)subproject.Value);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"SubProject",&local_51);
    local_30 = cmState::GetGlobalProperty(pcVar2,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    std::allocator<char>::~allocator(&local_51);
    bVar1 = cmValue::operator_cast_to_bool(&local_30);
    if (bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_88,"Subproject",(allocator<char> *)((long)&labels.Value + 7));
      cmXMLWriter::StartElement(xml,&local_88);
      std::__cxx11::string::~string((string *)&local_88);
      std::allocator<char>::~allocator((allocator<char> *)((long)&labels.Value + 7));
      psVar3 = cmValue::operator*[abi_cxx11_(&local_30);
      cmXMLWriter::Attribute<std::__cxx11::string>(xml,"name",psVar3);
      this_01 = cmCTestScriptHandler::GetCMake(this_00);
      pcVar2 = cmake::GetState(this_01);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_b8,"SubProjectLabels",&local_b9);
      local_98 = cmState::GetGlobalProperty(pcVar2,&local_b8);
      std::__cxx11::string::~string((string *)&local_b8);
      std::allocator<char>::~allocator(&local_b9);
      bVar1 = cmValue::operator_cast_to_bool(&local_98);
      if (bVar1) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_e0,"Labels",
                   (allocator<char> *)
                   ((long)&args.Values.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
        cmXMLWriter::StartElement(xml,&local_e0);
        std::__cxx11::string::~string((string *)&local_e0);
        std::allocator<char>::~allocator
                  ((allocator<char> *)
                   ((long)&args.Values.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
        psVar3 = cmValue::operator*[abi_cxx11_(&local_98);
        std::__cxx11::string::string((string *)&local_130,(string *)psVar3);
        local_110 = &local_130;
        local_108 = 1;
        init._M_len = 1;
        init._M_array = local_110;
        cmList::cmList((cmList *)local_100,init);
        local_268 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_110;
        do {
          local_268 = local_268 + -1;
          std::__cxx11::string::~string((string *)local_268);
        } while (local_268 != &local_130);
        __end3 = cmList::begin_abi_cxx11_((cmList *)local_100);
        i = (string *)cmList::end_abi_cxx11_((cmList *)local_100);
        while (bVar1 = __gnu_cxx::operator!=
                                 (&__end3,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                           *)&i), bVar1) {
          local_158 = __gnu_cxx::
                      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ::operator*(&__end3);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_178,"Label",(allocator<char> *)((long)&label.Value + 7));
          cmXMLWriter::Element<std::__cxx11::string>(xml,&local_178,local_158);
          std::__cxx11::string::~string((string *)&local_178);
          std::allocator<char>::~allocator((allocator<char> *)((long)&label.Value + 7));
          __gnu_cxx::
          __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::operator++(&__end3);
        }
        cmXMLWriter::EndElement(xml);
        cmList::~cmList((cmList *)local_100);
      }
      cmXMLWriter::EndElement(xml);
    }
    pcVar2 = cmake::GetState((cmake *)subproject.Value);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_1a8,"Label",&local_1a9);
    local_188 = cmState::GetGlobalProperty(pcVar2,&local_1a8);
    std::__cxx11::string::~string((string *)&local_1a8);
    std::allocator<char>::~allocator(&local_1a9);
    bVar1 = cmValue::operator_cast_to_bool(&local_188);
    if (bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_1d0,"Labels",&local_1d1);
      cmXMLWriter::StartElement(xml,&local_1d0);
      std::__cxx11::string::~string((string *)&local_1d0);
      std::allocator<char>::~allocator(&local_1d1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_1f8,"Label",&local_1f9);
      psVar3 = cmValue::operator*[abi_cxx11_(&local_188);
      cmXMLWriter::Element<std::__cxx11::string>(xml,&local_1f8,psVar3);
      std::__cxx11::string::~string((string *)&local_1f8);
      std::allocator<char>::~allocator(&local_1f9);
      cmXMLWriter::EndElement(xml);
    }
  }
  return;
}

Assistant:

void cmCTest::AddSiteProperties(cmXMLWriter& xml)
{
  cmCTestScriptHandler* ch = this->GetScriptHandler();
  cmake* cm = ch->GetCMake();
  // if no CMake then this is the old style script and props like
  // this will not work anyway.
  if (!cm) {
    return;
  }
  // This code should go when cdash is changed to use labels only
  cmValue subproject = cm->GetState()->GetGlobalProperty("SubProject");
  if (subproject) {
    xml.StartElement("Subproject");
    xml.Attribute("name", *subproject);
    cmValue labels =
      ch->GetCMake()->GetState()->GetGlobalProperty("SubProjectLabels");
    if (labels) {
      xml.StartElement("Labels");
      cmList args{ *labels };
      for (std::string const& i : args) {
        xml.Element("Label", i);
      }
      xml.EndElement();
    }
    xml.EndElement();
  }

  // This code should stay when cdash only does label based sub-projects
  cmValue label = cm->GetState()->GetGlobalProperty("Label");
  if (label) {
    xml.StartElement("Labels");
    xml.Element("Label", *label);
    xml.EndElement();
  }
}